

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ska2anm.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint32 uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char **ppcVar3;
  bool bVar4;
  char *local_78;
  char *local_68;
  char *file;
  Animation *anim;
  int32 firstword;
  undefined1 local_40 [8];
  StreamFile stream;
  char _argc;
  char *_argt;
  char *_args;
  char **argv_local;
  int argc_local;
  
  ppcVar3 = argv;
  rw::Engine::init((Engine *)0x0,(EVP_PKEY_CTX *)argv);
  iVar1 = (int)ppcVar3;
  rw::registerHAnimPlugin();
  rw::Engine::open((char *)0x0,iVar1);
  rw::Engine::start();
  if (argv0 == (char *)0x0) {
    argv0 = *argv;
  }
  _args = (char *)(argv + 1);
  argv_local._0_4_ = argc + -1;
  while( true ) {
    bVar4 = false;
    if ((*(long *)_args != 0) && (bVar4 = false, **(char **)_args == '-')) {
      bVar4 = *(char *)(*(long *)_args + 1) != '\0';
    }
    if (!bVar4) goto LAB_00102800;
    _argt = (char *)(*(long *)_args + 1);
    if ((*_argt == '-') && (*(char *)(*(long *)_args + 2) == '\0')) break;
    stream.file._7_1_ = '\0';
    while( true ) {
      bVar4 = false;
      if (*_argt != '\0') {
        stream.file._7_1_ = *_argt;
        bVar4 = stream.file._7_1_ != '\0';
        _argt = _argt + 1;
      }
      local_78 = _argt;
      if (!bVar4) break;
      if (stream.file._7_1_ == 'v') {
        _argt = "";
        if (*local_78 == '\0') {
          if (*(long *)(_args + 8) == 0) {
            usage();
            abort();
          }
          argv_local._0_4_ = (int)argv_local + -1;
          local_78 = *(char **)(_args + 8);
          _args = _args + 8;
        }
        else {
        }
        __isoc99_sscanf(local_78,"%x",&rw::version);
      }
      else {
        usage();
      }
    }
    argv_local._0_4_ = (int)argv_local + -1;
    _args = _args + 8;
  }
  argv_local._0_4_ = (int)argv_local + -1;
  _args = _args + 8;
LAB_00102800:
  if ((int)argv_local < 1) {
    usage();
  }
  rw::StreamFile::StreamFile((StreamFile *)local_40);
  iVar1 = rw::StreamFile::open((StreamFile *)local_40,*(char **)_args,0x15103f);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    fprintf(_stderr,"Error: couldn\'t open %s\n",*(undefined8 *)_args);
    argv_local._4_4_ = 1;
  }
  else {
    uVar2 = rw::Stream::readU32((Stream *)local_40);
    iVar1 = 0;
    rw::StreamFile::seek((StreamFile *)local_40,0,0);
    file = (char *)0x0;
    if (uVar2 == 0x1b) {
      iVar1 = 0x1b;
      bVar4 = rw::findChunk((Stream *)local_40,0x1b,(uint32 *)0x0,(uint32 *)0x0);
      if (bVar4) {
        file = (char *)rw::Animation::streamRead((Stream *)local_40);
      }
    }
    else {
      file = (char *)rw::Animation::streamReadLegacy((Stream *)local_40);
    }
    rw::StreamFile::close((StreamFile *)local_40,iVar1);
    if (file == (char *)0x0) {
      fprintf(_stderr,"Error: couldn\'t read anim file\n");
      argv_local._4_4_ = 1;
    }
    else {
      if ((int)argv_local < 2) {
        if (uVar2 == 0x1b) {
          local_68 = "out.ska";
        }
        else {
          local_68 = "out.anm";
        }
      }
      else {
        local_68 = *(char **)(_args + 8);
      }
      iVar1 = rw::StreamFile::open((StreamFile *)local_40,local_68,0x15108b);
      if (CONCAT44(extraout_var_00,iVar1) == 0) {
        fprintf(_stderr,"Error: couldn\'t open %s\n",local_68);
        argv_local._4_4_ = 1;
      }
      else {
        if (uVar2 == 0x1b) {
          rw::Animation::streamWriteLegacy((Animation *)file,(Stream *)local_40);
        }
        else {
          rw::Animation::streamWrite((Animation *)file,(Stream *)local_40);
        }
        rw::Animation::destroy((Animation *)file);
        argv_local._4_4_ = 0;
      }
    }
  }
  rw::StreamFile::~StreamFile((StreamFile *)local_40);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
	rw::Engine::init();
	rw::registerHAnimPlugin();
	rw::Engine::open(nil);
	rw::Engine::start();

	ARGBEGIN{
	case 'v':
		sscanf(EARGF(usage()), "%x", &rw::version);
		break;
	default:
		usage();
	}